

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

string * leveldb::MakeFileName
                   (string *__return_storage_ptr__,string *name,uint64_t number,char *suffix)

{
  pointer pcVar1;
  string *psVar2;
  char buf [100];
  char acStack_88 [104];
  
  snprintf(acStack_88,100,"/%06llu.%s",number,suffix);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
  psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar2;
}

Assistant:

static std::string MakeFileName(const std::string &name, uint64_t number,
                                    const char *suffix) {
        char buf[100];
        snprintf(buf, sizeof(buf), "/%06llu.%s",
                 static_cast<unsigned long long>(number),
                 suffix);
        return name + buf;
    }